

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Info.cpp
# Opt level: O3

string * FindPTypes_abi_cxx11_(string *__return_storage_ptr__,aiScene *scene)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  uint uVar10;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  undefined1 auVar11 [16];
  long *local_80 [2];
  long local_70 [2];
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  long *local_40;
  long local_38;
  long local_30;
  long lStack_28;
  
  uVar3 = scene->mNumMeshes;
  if ((ulong)uVar3 != 0) {
    uVar10 = 0;
    uVar12 = 0;
    uVar13 = 0;
    uVar14 = 0;
    uVar7 = 0;
    do {
      uVar1 = scene->mMeshes[uVar7]->mPrimitiveTypes;
      uVar10 = uVar10 | -(uint)((uVar1 & 1) == 1);
      uVar12 = uVar12 | -(uint)((uVar1 & 8) == 8);
      uVar13 = uVar13 | -(uint)((uVar1 & 4) == 4);
      uVar14 = uVar14 | -(uint)((uVar1 & 2) == 2);
      uVar7 = uVar7 + 1;
    } while (uVar3 != uVar7);
    auVar11._0_4_ = uVar10 << 0x1f;
    auVar11._4_4_ = uVar12 << 0x1f;
    auVar11._8_4_ = uVar13 << 0x1f;
    auVar11._12_4_ = uVar14 << 0x1f;
    uVar3 = movmskps(uVar3,auVar11);
    if ((uVar3 & 1) != 0) {
      pcVar9 = "points";
      pcVar8 = "";
      goto LAB_002e8852;
    }
  }
  pcVar8 = "";
  pcVar9 = "";
LAB_002e8852:
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,pcVar9,pcVar8);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_80);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_50 = *plVar5;
    lStack_48 = plVar4[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar5;
    local_60 = (long *)*plVar4;
  }
  local_58 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_60);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_30 = *plVar5;
    lStack_28 = plVar4[3];
    local_40 = &local_30;
  }
  else {
    local_30 = *plVar5;
    local_40 = (long *)*plVar4;
  }
  local_38 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_40);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar6) {
    lVar2 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_40 != &local_30) {
    operator_delete(local_40,local_30 + 1);
  }
  if (local_60 != &local_50) {
    operator_delete(local_60,local_50 + 1);
  }
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FindPTypes(const aiScene* scene)
{
	bool haveit[4] = {0};
	for(unsigned int i = 0; i < scene->mNumMeshes; ++i) {
		const unsigned int pt = scene->mMeshes[i]->mPrimitiveTypes;
		if (pt & aiPrimitiveType_POINT) {
			haveit[0]=true;
		}
		if (pt & aiPrimitiveType_LINE) {
			haveit[1]=true;
		}
		if (pt & aiPrimitiveType_TRIANGLE) {
			haveit[2]=true;
		}
		if (pt & aiPrimitiveType_POLYGON) {
			haveit[3]=true;
		}
	}
	return (haveit[0]?std::string("points"):"")+(haveit[1]?"lines":"")+
		(haveit[2]?"triangles":"")+(haveit[3]?"n-polygons":"");
}